

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigShow.c
# Opt level: O0

void Aig_WriteDotAig(Aig_Man_t *pMan,char *pFileName,int fHaig,Vec_Ptr_t *vBold)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  char *pcVar8;
  int local_48;
  uint local_44;
  int i;
  int Level;
  int Prev;
  int LevelMax;
  Aig_Obj_t *pNode;
  FILE *pFile;
  Vec_Ptr_t *vBold_local;
  int fHaig_local;
  char *pFileName_local;
  Aig_Man_t *pMan_local;
  
  iVar1 = Aig_ManNodeNum(pMan);
  if (iVar1 < 0xc9) {
    __stream = fopen(pFileName,"w");
    if (__stream == (FILE *)0x0) {
      fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    }
    else {
      if (vBold != (Vec_Ptr_t *)0x0) {
        for (local_48 = 0; iVar1 = Vec_PtrSize(vBold), local_48 < iVar1; local_48 = local_48 + 1) {
          pvVar5 = Vec_PtrEntry(vBold,local_48);
          *(ulong *)((long)pvVar5 + 0x18) =
               *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf | 0x20;
        }
      }
      uVar2 = Aig_ManLevels(pMan);
      uVar3 = uVar2 + 1;
      for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pvVar5 = Vec_PtrEntry(pMan->vCos,local_48);
        *(ulong *)((long)pvVar5 + 0x18) =
             *(ulong *)((long)pvVar5 + 0x18) & 0xff000000ffffffff |
             ((ulong)uVar3 & 0xffffff) << 0x20;
      }
      fprintf(__stream,"# %s\n","AIG structure generated by IVY package");
      fprintf(__stream,"\n");
      fprintf(__stream,"digraph AIG {\n");
      fprintf(__stream,"size = \"7.5,10\";\n");
      fprintf(__stream,"center = true;\n");
      fprintf(__stream,"edge [dir = back];\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  node [shape = plaintext];\n");
      fprintf(__stream,"  edge [style = invis];\n");
      fprintf(__stream,"  LevelTitle1 [label=\"\"];\n");
      fprintf(__stream,"  LevelTitle2 [label=\"\"];\n");
      for (local_44 = uVar3; -1 < (int)local_44; local_44 = local_44 - 1) {
        fprintf(__stream,"  Level%d",(ulong)local_44);
        fprintf(__stream," [label = ");
        fprintf(__stream,"\"");
        fprintf(__stream,"\"");
        fprintf(__stream,"];\n");
      }
      fprintf(__stream,"  LevelTitle1 ->  LevelTitle2 ->");
      for (local_44 = uVar3; -1 < (int)local_44; local_44 = local_44 - 1) {
        fprintf(__stream,"  Level%d",(ulong)local_44);
        if (local_44 == 0) {
          fprintf(__stream,";");
        }
        else {
          fprintf(__stream," ->");
        }
      }
      fprintf(__stream,"\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle1;\n");
      fprintf(__stream,"  title1 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=20,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      fprintf(__stream,"%s","AIG structure visualized by ABC");
      fprintf(__stream,"\\n");
      fprintf(__stream,"Benchmark \\\"%s\\\". ","aig");
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  LevelTitle2;\n");
      fprintf(__stream,"  title2 [shape=plaintext,\n");
      fprintf(__stream,"          fontsize=18,\n");
      fprintf(__stream,"          fontname = \"Times-Roman\",\n");
      fprintf(__stream,"          label=\"");
      uVar4 = Aig_ManNodeNum(pMan);
      fprintf(__stream,"The set contains %d logic nodes and spans %d levels.",(ulong)uVar4,
              (ulong)uVar3);
      fprintf(__stream,"\\n");
      fprintf(__stream,"\"\n");
      fprintf(__stream,"         ];\n");
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",(ulong)uVar3);
      for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pvVar5 = Vec_PtrEntry(pMan->vCos,local_48);
        fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)*(uint *)((long)pvVar5 + 0x24),
                (ulong)*(uint *)((long)pvVar5 + 0x24));
        fprintf(__stream,", shape = %s","invtriangle");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      for (local_44 = uVar2; 0 < (int)local_44; local_44 = local_44 - 1) {
        fprintf(__stream,"{\n");
        fprintf(__stream,"  rank = same;\n");
        fprintf(__stream,"  Level%d;\n",(ulong)local_44);
        for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vObjs), local_48 < iVar1;
            local_48 = local_48 + 1) {
          pvVar5 = Vec_PtrEntry(pMan->vObjs,local_48);
          if ((pvVar5 != (void *)0x0) &&
             (((uint)((ulong)*(undefined8 *)((long)pvVar5 + 0x18) >> 0x20) & 0xffffff) == local_44))
          {
            fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)*(uint *)((long)pvVar5 + 0x24),
                    (ulong)*(uint *)((long)pvVar5 + 0x24));
            fprintf(__stream,", shape = ellipse");
            if ((vBold != (Vec_Ptr_t *)0x0) && ((*(ulong *)((long)pvVar5 + 0x18) >> 5 & 1) != 0)) {
              fprintf(__stream,", style = filled");
            }
            fprintf(__stream,"];\n");
          }
        }
        fprintf(__stream,"}");
        fprintf(__stream,"\n");
        fprintf(__stream,"\n");
      }
      fprintf(__stream,"{\n");
      fprintf(__stream,"  rank = same;\n");
      fprintf(__stream,"  Level%d;\n",0);
      pAVar6 = Aig_ManConst1(pMan);
      iVar1 = Aig_ObjRefs(pAVar6);
      if (0 < iVar1) {
        pAVar6 = Aig_ManConst1(pMan);
        fprintf(__stream,"  Node%d [label = \"Const1\"",(ulong)(uint)pAVar6->Id);
        fprintf(__stream,", shape = ellipse");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
      }
      for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vCis), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pvVar5 = Vec_PtrEntry(pMan->vCis,local_48);
        fprintf(__stream,"  Node%d [label = \"%d\"",(ulong)*(uint *)((long)pvVar5 + 0x24),
                (ulong)*(uint *)((long)pvVar5 + 0x24));
        fprintf(__stream,", shape = %s","triangle");
        fprintf(__stream,", color = coral, fillcolor = coral");
        fprintf(__stream,"];\n");
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fprintf(__stream,"title1 -> title2 [style = invis];\n");
      for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pvVar5 = Vec_PtrEntry(pMan->vCos,local_48);
        fprintf(__stream,"title2 -> Node%d [style = invis];\n",(ulong)*(uint *)((long)pvVar5 + 0x24)
               );
      }
      i = -1;
      for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pvVar5 = Vec_PtrEntry(pMan->vCos,local_48);
        if (0 < local_48) {
          fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)(uint)i,
                  (ulong)*(uint *)((long)pvVar5 + 0x24));
        }
        i = *(int *)((long)pvVar5 + 0x24);
      }
      for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vObjs), local_48 < iVar1; local_48 = local_48 + 1
          ) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vObjs,local_48);
        if ((pAVar6 != (Aig_Obj_t *)0x0) &&
           (((iVar1 = Aig_ObjIsNode(pAVar6), iVar1 != 0 || (iVar1 = Aig_ObjIsCo(pAVar6), iVar1 != 0)
             ) || (iVar1 = Aig_ObjIsBuf(pAVar6), iVar1 != 0)))) {
          fprintf(__stream,"Node%d",(ulong)(uint)pAVar6->Id);
          fprintf(__stream," -> ");
          uVar2 = Aig_ObjFaninId0(pAVar6);
          fprintf(__stream,"Node%d",(ulong)uVar2);
          fprintf(__stream," [");
          iVar1 = Aig_ObjFaninC0(pAVar6);
          pcVar8 = "bold";
          if (iVar1 != 0) {
            pcVar8 = "dotted";
          }
          fprintf(__stream,"style = %s",pcVar8);
          fprintf(__stream,"]");
          fprintf(__stream,";\n");
          iVar1 = Aig_ObjIsNode(pAVar6);
          if (iVar1 != 0) {
            fprintf(__stream,"Node%d",(ulong)(uint)pAVar6->Id);
            fprintf(__stream," -> ");
            uVar2 = Aig_ObjFaninId1(pAVar6);
            fprintf(__stream,"Node%d",(ulong)uVar2);
            fprintf(__stream," [");
            iVar1 = Aig_ObjFaninC1(pAVar6);
            pcVar8 = "bold";
            if (iVar1 != 0) {
              pcVar8 = "dotted";
            }
            fprintf(__stream,"style = %s",pcVar8);
            fprintf(__stream,"]");
            fprintf(__stream,";\n");
          }
        }
      }
      fprintf(__stream,"}");
      fprintf(__stream,"\n");
      fprintf(__stream,"\n");
      fclose(__stream);
      if (vBold != (Vec_Ptr_t *)0x0) {
        for (local_48 = 0; iVar1 = Vec_PtrSize(vBold), local_48 < iVar1; local_48 = local_48 + 1) {
          pvVar5 = Vec_PtrEntry(vBold,local_48);
          *(ulong *)((long)pvVar5 + 0x18) = *(ulong *)((long)pvVar5 + 0x18) & 0xffffffffffffffdf;
        }
      }
      for (local_48 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_48 < iVar1; local_48 = local_48 + 1)
      {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,local_48);
        pAVar7 = Aig_ObjFanin0(pAVar6);
        *(ulong *)&pAVar6->field_0x18 =
             *(ulong *)&pAVar6->field_0x18 & 0xff000000ffffffff |
             (ulong)((uint)((ulong)*(undefined8 *)&pAVar7->field_0x18 >> 0x20) & 0xffffff) << 0x20;
      }
    }
  }
  else {
    fprintf(_stdout,"Cannot visualize AIG with more than 200 nodes.\n");
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the graph structure of AIG for DOT.]

  Description [Useful for graph visualization using tools such as GraphViz: 
  http://www.graphviz.org/]
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Aig_WriteDotAig( Aig_Man_t * pMan, char * pFileName, int fHaig, Vec_Ptr_t * vBold )
{
    FILE * pFile;
    Aig_Obj_t * pNode;//, * pTemp, * pPrev;
    int LevelMax, Prev, Level, i;

    if ( Aig_ManNodeNum(pMan) > 200 )
    {
        fprintf( stdout, "Cannot visualize AIG with more than 200 nodes.\n" );
        return;
    }
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // mark the nodes
    if ( vBold )
        Vec_PtrForEachEntry( Aig_Obj_t *, vBold, pNode, i )
            pNode->fMarkB = 1;

    // compute levels
//    LevelMax = 1 + Aig_ManSetLevels( pMan, fHaig );
    LevelMax = 1 + Aig_ManLevels( pMan );
    Aig_ManForEachCo( pMan, pNode, i )
        pNode->Level = LevelMax;

    // write the DOT header
    fprintf( pFile, "# %s\n",  "AIG structure generated by IVY package" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph AIG {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//  fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= 0; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != 0 )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "AIG structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", "aig" );
//    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "The set contains %d logic nodes and spans %d levels.", Aig_ManNodeNum(pMan), LevelMax );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the COs
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  LevelMax );
    // generate the CO nodes
    Aig_ManForEachCo( pMan, pNode, i )
    {
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_in":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_in":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_in":""), 
                    Aig_Regular(pNode->pEquiv)->Id, Aig_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id ); 

        fprintf( pFile, ", shape = %s", "invtriangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate nodes of each rank
    for ( Level = LevelMax - 1; Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Aig_ManForEachObj( pMan, pNode, i )
        {
            if ( (int)pNode->Level != Level )
                continue;
/*
            if ( fHaig || pNode->pEquiv == NULL )
                fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            else 
                fprintf( pFile, "  Node%d [label = \"%d(%d%s)\"", pNode->Id, pNode->Id, 
                    Aig_Regular(pNode->pEquiv)->Id, Aig_IsComplement(pNode->pEquiv)? "\'":"" );
*/
            fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id ); 

            fprintf( pFile, ", shape = ellipse" );
            if ( vBold && pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the CI nodes
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    // the labeling node of this level
    fprintf( pFile, "  Level%d;\n",  0 );
    // generate constant node
    if ( Aig_ObjRefs(Aig_ManConst1(pMan)) > 0 )
    {
        pNode = Aig_ManConst1(pMan);
        // check if the costant node is present
        fprintf( pFile, "  Node%d [label = \"Const1\"", pNode->Id );
        fprintf( pFile, ", shape = ellipse" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    // generate the CI nodes
    Aig_ManForEachCi( pMan, pNode, i )
    {
/*
        if ( fHaig || pNode->pEquiv == NULL )
            fprintf( pFile, "  Node%d%s [label = \"%d%s\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_out":"") );
        else
            fprintf( pFile, "  Node%d%s [label = \"%d%s(%d%s)\"", pNode->Id, 
                (Aig_ObjIsLatch(pNode)? "_out":""), pNode->Id, (Aig_ObjIsLatch(pNode)? "_out":""), 
                    Aig_Regular(pNode->pEquiv)->Id, Aig_IsComplement(pNode->pEquiv)? "\'":"" );
*/
        fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id ); 

        fprintf( pFile, ", shape = %s", "triangle" );
        fprintf( pFile, ", color = coral, fillcolor = coral" );
        fprintf( pFile, "];\n" );
    }
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Aig_ManForEachCo( pMan, pNode, i )
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", pNode->Id );
    // generate invisible edges among the COs
    Prev = -1;
    Aig_ManForEachCo( pMan, pNode, i )
    {
        if ( i > 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, pNode->Id );
        Prev = pNode->Id;
    }

    // generate edges
    Aig_ManForEachObj( pMan, pNode, i )
    {
        if ( !Aig_ObjIsNode(pNode) && !Aig_ObjIsCo(pNode) && !Aig_ObjIsBuf(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  pNode->Id );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Aig_ObjFaninId0(pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Aig_ObjFaninC0(pNode)? "dotted" : "bold" );
//        if ( Aig_NtkIsSeq(pNode->pMan) && Seq_ObjFaninL0(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,0) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
        if ( !Aig_ObjIsNode(pNode) )
            continue;
        // generate the edge from this node to the next
        fprintf( pFile, "Node%d",  pNode->Id );
        fprintf( pFile, " -> " );
        fprintf( pFile, "Node%d",  Aig_ObjFaninId1(pNode) );
        fprintf( pFile, " [" );
        fprintf( pFile, "style = %s", Aig_ObjFaninC1(pNode)? "dotted" : "bold" );
//        if ( Aig_NtkIsSeq(pNode->pMan) && Seq_ObjFaninL1(pNode) > 0 )
//        fprintf( pFile, ", label = \"%s\"", Seq_ObjFaninGetInitPrintable(pNode,1) );
        fprintf( pFile, "]" );
        fprintf( pFile, ";\n" );
/*
        // generate the edges between the equivalent nodes
        if ( fHaig && pNode->pEquiv && Aig_ObjRefs(pNode) > 0 )
        {
            pPrev = pNode;
            for ( pTemp = pNode->pEquiv; pTemp != pNode; pTemp = Aig_Regular(pTemp->pEquiv) )
            {
                fprintf( pFile, "Node%d",  pPrev->Id );
                fprintf( pFile, " -> " );
                fprintf( pFile, "Node%d",  pTemp->Id );
                fprintf( pFile, " [style = %s]", Aig_IsComplement(pTemp->pEquiv)? "dotted" : "bold" );
                fprintf( pFile, ";\n" );
                pPrev = pTemp;
            }
            // connect the last node with the first
            fprintf( pFile, "Node%d",  pPrev->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " [style = %s]", Aig_IsComplement(pPrev->pEquiv)? "dotted" : "bold" );
            fprintf( pFile, ";\n" );
        }
*/
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark nodes
    if ( vBold )
        Vec_PtrForEachEntry( Aig_Obj_t *, vBold, pNode, i )
            pNode->fMarkB = 0;

    Aig_ManForEachCo( pMan, pNode, i )
        pNode->Level = Aig_ObjFanin0(pNode)->Level;
}